

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search.c
# Opt level: O2

int av1_search_palette_mode
              (IntraModeSearchState *intra_search_state,AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize
              ,uint ref_frame_cost,PICK_MODE_CONTEXT *ctx,RD_STATS *this_rd_cost,int64_t best_rd)

{
  MACROBLOCKD *xd;
  uint8_t uVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  MB_MODE_INFO *__src;
  uint8_t *__dest;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  int64_t iVar10;
  TX_SIZE max_tx_size;
  UV_PREDICTION_MODE UVar11;
  uint uVar12;
  int (*paiVar13) [2];
  undefined7 in_register_00000009;
  long lVar14;
  uint uVar15;
  long lVar16;
  PALETTE_BUFFER *xd_00;
  ulong uVar17;
  long lVar18;
  uint uVar19;
  bool bVar20;
  int64_t best_rd_palette;
  RD_STATS rd_stats_y;
  MB_MODE_INFO best_mbmi_palette;
  uint8_t best_tx_type_map [1024];
  uint8_t best_blk_skip [1024];
  
  lVar16 = 0x7fffffffffffffff;
  __src = *(x->e_mbd).mi;
  uVar1 = ((cpi->common).seq_params)->monochrome;
  best_rd_palette = best_rd;
  xd_00 = x->palette_buffer;
  __dest = (x->e_mbd).plane[0].color_index_map;
  memcpy(&best_mbmi_palette,__src,0xb0);
  uVar17 = CONCAT71(in_register_00000009,bsize) & 0xffffffff;
  bVar2 = ""[uVar17];
  bVar3 = block_size_high[uVar17];
  bVar4 = block_size_wide[uVar17];
  __src->mode = '\0';
  __src->uv_mode = '\0';
  __src->ref_frame[0] = '\0';
  __src->ref_frame[1] = -1;
  (__src->palette_mode_info).palette_size[0] = '\0';
  (__src->palette_mode_info).palette_size[1] = '\0';
  rd_stats_y.rate = 0x7fffffff;
  rd_stats_y.zero_rate = 0;
  rd_stats_y.dist = 0x7fffffffffffffff;
  rd_stats_y.rdcost = 0x7fffffffffffffff;
  rd_stats_y.sse = 0x7fffffffffffffff;
  rd_stats_y.skip_txfm = '\0';
  av1_rd_pick_palette_intra_sby
            (cpi,x,bsize,(x->mode_costs).mbmode_cost[bVar2][0],&best_mbmi_palette,
             xd_00->best_palette_color_map,&best_rd_palette,&rd_stats_y.rate,(int *)0x0,
             &rd_stats_y.dist,&rd_stats_y.skip_txfm,(int *)0x0,ctx,best_blk_skip,best_tx_type_map);
  uVar12 = 0;
  if ((rd_stats_y.rate == 0x7fffffff) || ((__src->palette_mode_info).palette_size[0] == '\0'))
  goto LAB_0022dc52;
  xd = &x->e_mbd;
  memcpy((x->txfm_search_info).blk_skip,best_blk_skip,
         (long)(1 << ("\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"[uVar17] - 4 &
                     0x1f)));
  memcpy((x->e_mbd).tx_type_map,best_tx_type_map,(long)ctx->num_4x4_blk);
  memcpy(__dest,xd_00,(ulong)bVar4 * (ulong)bVar3);
  iVar10 = rd_stats_y.dist;
  uVar19 = rd_stats_y.rate + ref_frame_cost;
  uVar15 = (uint)rd_stats_y.skip_txfm;
  if (uVar1 == '\0') {
    if (intra_search_state->rate_uv_intra == 0x7fffffff) {
      max_tx_size = av1_get_tx_size((int)xd,(MACROBLOCKD *)xd_00);
      av1_rd_pick_intra_sbuv_mode
                (cpi,x,&intra_search_state->rate_uv_intra,&intra_search_state->rate_uv_tokenonly,
                 &intra_search_state->dist_uvs,&intra_search_state->skip_uvs,bsize,max_tx_size);
      UVar11 = __src->uv_mode;
      intra_search_state->mode_uv = UVar11;
      *(undefined2 *)(intra_search_state->pmi_uv).palette_size =
           *(undefined2 *)(__src->palette_mode_info).palette_size;
      uVar5 = *(undefined8 *)(__src->palette_mode_info).palette_colors;
      uVar6 = *(undefined8 *)((__src->palette_mode_info).palette_colors + 4);
      uVar7 = *(undefined8 *)((__src->palette_mode_info).palette_colors + 8);
      uVar8 = *(undefined8 *)((__src->palette_mode_info).palette_colors + 0xc);
      uVar9 = *(undefined8 *)((__src->palette_mode_info).palette_colors + 0x14);
      *(undefined8 *)((intra_search_state->pmi_uv).palette_colors + 0x10) =
           *(undefined8 *)((__src->palette_mode_info).palette_colors + 0x10);
      *(undefined8 *)((intra_search_state->pmi_uv).palette_colors + 0x14) = uVar9;
      *(undefined8 *)((intra_search_state->pmi_uv).palette_colors + 8) = uVar7;
      *(undefined8 *)((intra_search_state->pmi_uv).palette_colors + 0xc) = uVar8;
      *(undefined8 *)(intra_search_state->pmi_uv).palette_colors = uVar5;
      *(undefined8 *)((intra_search_state->pmi_uv).palette_colors + 4) = uVar6;
      intra_search_state->uv_angle_delta = __src->angle_delta[1];
    }
    else {
      UVar11 = intra_search_state->mode_uv;
    }
    uVar12 = 1;
    __src->uv_mode = UVar11;
    uVar1 = (intra_search_state->pmi_uv).palette_size[1];
    (__src->palette_mode_info).palette_size[1] = uVar1;
    if (uVar1 != '\0') {
      uVar5 = *(undefined8 *)((intra_search_state->pmi_uv).palette_colors + 8);
      uVar6 = *(undefined8 *)((intra_search_state->pmi_uv).palette_colors + 0xc);
      uVar7 = *(undefined8 *)((intra_search_state->pmi_uv).palette_colors + 0x14);
      *(undefined8 *)((__src->palette_mode_info).palette_colors + 0x10) =
           *(undefined8 *)((intra_search_state->pmi_uv).palette_colors + 0x10);
      *(undefined8 *)((__src->palette_mode_info).palette_colors + 0x14) = uVar7;
      *(undefined8 *)((__src->palette_mode_info).palette_colors + 8) = uVar5;
      *(undefined8 *)((__src->palette_mode_info).palette_colors + 0xc) = uVar6;
    }
    __src->angle_delta[1] = intra_search_state->uv_angle_delta;
    if (uVar15 == 0) {
      bVar20 = true;
    }
    else {
      bVar20 = intra_search_state->skip_uvs == '\0';
    }
    lVar18 = iVar10 + intra_search_state->dist_uvs;
    uVar19 = uVar19 + intra_search_state->rate_uv_intra;
    if (bVar20) goto LAB_0022dbda;
    ref_frame_cost = uVar19 - (rd_stats_y.rate + intra_search_state->rate_uv_tokenonly);
LAB_0022dc06:
    uVar19 = av1_get_skip_txfm_context(xd);
    paiVar13 = (int (*) [2])((x->mode_costs).skip_txfm_cost[uVar19] + 1);
  }
  else {
    lVar18 = rd_stats_y.dist;
    uVar12 = uVar15;
    if (uVar15 != 0) goto LAB_0022dc06;
LAB_0022dbda:
    ref_frame_cost = uVar19;
    uVar12 = av1_get_skip_txfm_context(xd);
    paiVar13 = (x->mode_costs).skip_txfm_cost + uVar12;
    uVar12 = 0;
  }
  lVar14 = (long)(int)ref_frame_cost + (long)(*paiVar13)[0];
  lVar16 = lVar18 * 0x80 + (x->rdmult * lVar14 + 0x100 >> 9);
  this_rd_cost->rate = (int)lVar14;
  this_rd_cost->dist = lVar18;
LAB_0022dc52:
  this_rd_cost->rdcost = lVar16;
  return uVar12;
}

Assistant:

int av1_search_palette_mode(IntraModeSearchState *intra_search_state,
                            const AV1_COMP *cpi, MACROBLOCK *x,
                            BLOCK_SIZE bsize, unsigned int ref_frame_cost,
                            PICK_MODE_CONTEXT *ctx, RD_STATS *this_rd_cost,
                            int64_t best_rd) {
  const AV1_COMMON *const cm = &cpi->common;
  MB_MODE_INFO *const mbmi = x->e_mbd.mi[0];
  PALETTE_MODE_INFO *const pmi = &mbmi->palette_mode_info;
  const int num_planes = av1_num_planes(cm);
  MACROBLOCKD *const xd = &x->e_mbd;
  int rate2 = 0;
  int64_t distortion2 = 0, best_rd_palette = best_rd, this_rd;
  int skippable = 0;
  uint8_t *const best_palette_color_map =
      x->palette_buffer->best_palette_color_map;
  uint8_t *const color_map = xd->plane[0].color_index_map;
  MB_MODE_INFO best_mbmi_palette = *mbmi;
  uint8_t best_blk_skip[MAX_MIB_SIZE * MAX_MIB_SIZE];
  uint8_t best_tx_type_map[MAX_MIB_SIZE * MAX_MIB_SIZE];
  const ModeCosts *mode_costs = &x->mode_costs;
  const int *const intra_mode_cost =
      mode_costs->mbmode_cost[size_group_lookup[bsize]];
  const int rows = block_size_high[bsize];
  const int cols = block_size_wide[bsize];

  mbmi->mode = DC_PRED;
  mbmi->uv_mode = UV_DC_PRED;
  mbmi->ref_frame[0] = INTRA_FRAME;
  mbmi->ref_frame[1] = NONE_FRAME;
  av1_zero(pmi->palette_size);

  RD_STATS rd_stats_y;
  av1_invalid_rd_stats(&rd_stats_y);
  av1_rd_pick_palette_intra_sby(cpi, x, bsize, intra_mode_cost[DC_PRED],
                                &best_mbmi_palette, best_palette_color_map,
                                &best_rd_palette, &rd_stats_y.rate, NULL,
                                &rd_stats_y.dist, &rd_stats_y.skip_txfm, NULL,
                                ctx, best_blk_skip, best_tx_type_map);
  if (rd_stats_y.rate == INT_MAX || pmi->palette_size[0] == 0) {
    this_rd_cost->rdcost = INT64_MAX;
    return skippable;
  }

  memcpy(x->txfm_search_info.blk_skip, best_blk_skip,
         sizeof(best_blk_skip[0]) * bsize_to_num_blk(bsize));
  av1_copy_array(xd->tx_type_map, best_tx_type_map, ctx->num_4x4_blk);
  memcpy(color_map, best_palette_color_map,
         rows * cols * sizeof(best_palette_color_map[0]));

  skippable = rd_stats_y.skip_txfm;
  distortion2 = rd_stats_y.dist;
  rate2 = rd_stats_y.rate + ref_frame_cost;
  if (num_planes > 1) {
    if (intra_search_state->rate_uv_intra == INT_MAX) {
      // We have not found any good uv mode yet, so we need to search for it.
      TX_SIZE uv_tx = av1_get_tx_size(AOM_PLANE_U, xd);
      av1_rd_pick_intra_sbuv_mode(cpi, x, &intra_search_state->rate_uv_intra,
                                  &intra_search_state->rate_uv_tokenonly,
                                  &intra_search_state->dist_uvs,
                                  &intra_search_state->skip_uvs, bsize, uv_tx);
      intra_search_state->mode_uv = mbmi->uv_mode;
      intra_search_state->pmi_uv = *pmi;
      intra_search_state->uv_angle_delta = mbmi->angle_delta[PLANE_TYPE_UV];
    }

    // We have found at least one good uv mode before, so copy and paste it
    // over.
    mbmi->uv_mode = intra_search_state->mode_uv;
    pmi->palette_size[1] = intra_search_state->pmi_uv.palette_size[1];
    if (pmi->palette_size[1] > 0) {
      memcpy(pmi->palette_colors + PALETTE_MAX_SIZE,
             intra_search_state->pmi_uv.palette_colors + PALETTE_MAX_SIZE,
             2 * PALETTE_MAX_SIZE * sizeof(pmi->palette_colors[0]));
    }
    mbmi->angle_delta[PLANE_TYPE_UV] = intra_search_state->uv_angle_delta;
    skippable = skippable && intra_search_state->skip_uvs;
    distortion2 += intra_search_state->dist_uvs;
    rate2 += intra_search_state->rate_uv_intra;
  }

  if (skippable) {
    rate2 -= rd_stats_y.rate;
    if (num_planes > 1) rate2 -= intra_search_state->rate_uv_tokenonly;
    rate2 += mode_costs->skip_txfm_cost[av1_get_skip_txfm_context(xd)][1];
  } else {
    rate2 += mode_costs->skip_txfm_cost[av1_get_skip_txfm_context(xd)][0];
  }
  this_rd = RDCOST(x->rdmult, rate2, distortion2);
  this_rd_cost->rate = rate2;
  this_rd_cost->dist = distortion2;
  this_rd_cost->rdcost = this_rd;
  return skippable;
}